

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream * QtPrivate::readArrayBasedContainer<QList<QVariant>>(QDataStream *s,QList<QVariant> *c)

{
  QDataStream QVar1;
  QDataStream QVar2;
  char cVar3;
  undefined8 asize;
  long in_FS_OFFSET;
  quint32 first;
  qint64 extendedLen;
  uint local_5c;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar3 = QDataStream::isDeviceTransactionStarted();
  if (cVar3 == '\0') {
    QDataStream::resetStatus();
  }
  QList<QVariant>::clear(c);
  local_5c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_5c);
  asize = ZEXT48(local_5c);
  if ((PrivateShared *)asize == (PrivateShared *)0xffffffff) {
    asize = (PrivateShared *)0xffffffffffffffff;
  }
  else if ((local_5c == 0xfffffffe) && (0x15 < *(int *)(s + 0x18))) {
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,(longlong *)local_58.data);
    asize = local_58.shared;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<QVariant>::reserve(c,asize);
    if ((PrivateShared *)asize != (PrivateShared *)0x0) {
      do {
        asize = asize + -1;
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = 0;
        local_58._16_8_ = 0;
        local_40 = 2;
        ::operator>>(s,(QVariant *)&local_58);
        QVar2 = s[0x13];
        if (QVar2 == (QDataStream)0x0) {
          QMovableArrayOps<QVariant>::emplace<QVariant_const&>
                    ((QMovableArrayOps<QVariant> *)c,(c->d).size,(QVariant *)&local_58);
          QList<QVariant>::end(c);
        }
        else {
          QList<QVariant>::clear(c);
        }
        ::QVariant::~QVariant((QVariant *)&local_58);
      } while ((QVar2 == (QDataStream)0x0) && ((PrivateShared *)asize != (PrivateShared *)0x0));
    }
  }
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}